

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool SubtractionHelper<unsigned_long,_int,_5>::Subtract
               (unsigned_long *lhs,int *rhs,unsigned_long *result)

{
  uint32_t uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)*rhs;
  if ((long)uVar2 < 0) {
    uVar2 = *lhs;
    uVar1 = AbsValueHelper<int,_0>::Abs(*rhs);
    *result = uVar1 + uVar2;
    if (!CARRY8((ulong)uVar1,uVar2)) {
      return true;
    }
  }
  else if (uVar2 <= *lhs) {
    *result = *lhs - uVar2;
    return true;
  }
  return false;
}

Assistant:

static bool Subtract( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // lhs is an std::uint64_t, rhs signed
        // must first see if rhs is positive or negative
        if( rhs >= 0 )
        {
            if( (std::uint64_t)rhs <= lhs )
            {
                result = (T)( lhs - (std::uint64_t)rhs );
                return true;
            }
        }
        else
        {
            T tmp = lhs;
            // we're now effectively adding
            result = lhs + AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( rhs );

            if(result >= tmp)
                return true;
        }

        return false;
    }